

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O2

bool __thiscall
QTemporaryFileEngine::materializeUnnamedFile
          (QTemporaryFileEngine *this,QString *newName,MaterializationMode mode)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  byte bVar4;
  QString *newName_00;
  long in_FS_OFFSET;
  QSystemError local_e0;
  anon_class_32_2_9f8265eb local_d8;
  anon_class_8_1_8991fb9c_for_success local_b8;
  QArrayDataPointer<char> local_b0;
  QArrayDataPointer<char> local_98;
  QFileSystemEntry dst;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::number((QByteArray *)&local_d8,
                     *(int *)&(this->super_QFSFileEngine).super_QAbstractFileEngine.d_ptr.d[3].q_ptr
                     ,10);
  dst.m_nativeFilePath.d.d = (Data *)local_d8.materializeAt.src.d.size;
  dst.m_filePath.d.size = (qsizetype)local_d8.materializeAt.src.d.ptr;
  dst.m_filePath.d.ptr = (char16_t *)local_d8.materializeAt.src.d.d;
  dst.m_filePath.d.d = (Data *)anon_var_dwarf_4723ce;
  local_d8.materializeAt.src.d.d = (Data *)0x0;
  local_d8.materializeAt.src.d.ptr = (char *)0x0;
  local_d8.materializeAt.src.d.size = 0;
  QStringBuilder<const_char_(&)[15],_QByteArray>::convertTo<QByteArray>
            ((QByteArray *)&local_98,(QStringBuilder<const_char_(&)[15],_QByteArray> *)&dst);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dst.m_filePath.d.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
  local_b0.d = local_98.d;
  local_b0.ptr = local_98.ptr;
  local_b0.size = local_98.size;
  if (local_98.d == (Data *)0x0) {
    local_d8.materializeAt.src.d.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_d8.materializeAt.src.d.d = local_98.d;
  }
  local_d8.materializeAt.src.d.ptr = local_98.ptr;
  local_d8.materializeAt.src.d.size = local_98.size;
  if (local_d8.materializeAt.src.d.d != (Data *)0x0) {
    LOCK();
    ((local_d8.materializeAt.src.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_d8.materializeAt.src.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8.success.this = this;
  local_b8.this = this;
  if (mode == NameIsTemplate) {
    bVar2 = materializeUnnamedFile::anon_class_32_2_9f8265eb::operator()(&local_d8,newName);
    bVar4 = 1;
    if (bVar2) goto LAB_0023dba2;
  }
  else {
    dst._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    dst.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    dst.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    dst.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    dst.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    dst.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    dst.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry(&dst,newName);
    bVar2 = materializeUnnamedFile::anon_class_32_2_9f8265eb::
            anon_class_24_1_ba1d7944_for_materializeAt::operator()
                      ((anon_class_24_1_ba1d7944_for_materializeAt *)&local_b0,&dst);
    if (bVar2) {
      materializeUnnamedFile::anon_class_32_2_9f8265eb::anon_class_8_1_8991fb9c_for_success::
      operator()(&local_b8,&dst);
      mode = DontOverwrite;
LAB_0023db55:
      bVar2 = false;
    }
    else {
      piVar3 = __errno_location();
      bVar2 = true;
      if ((mode == Overwrite) && (*piVar3 == 0x11)) {
        newName_00 = this->templateName;
        bVar2 = materializeUnnamedFile::anon_class_32_2_9f8265eb::operator()(&local_d8,newName_00);
        if (bVar2) {
          QFSFileEngine::close(&this->super_QFSFileEngine,(int)newName_00);
          bVar2 = QFSFileEngine::renameOverwrite(&this->super_QFSFileEngine,newName);
          mode = (MaterializationMode)bVar2;
        }
        else {
          mode = Overwrite;
        }
        goto LAB_0023db55;
      }
    }
    bVar4 = (byte)mode;
    QFileSystemEntry::~QFileSystemEntry(&dst);
    if (!bVar2) goto LAB_0023dba2;
  }
  piVar3 = __errno_location();
  local_e0.errorCode = *piVar3;
  local_e0.errorScope = NativeError;
  QSystemError::toString(&dst.m_filePath,&local_e0);
  QAbstractFileEngine::setError((QAbstractFileEngine *)this,RenameError,&dst.m_filePath);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dst);
  bVar4 = 0;
LAB_0023dba2:
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool QTemporaryFileEngine::materializeUnnamedFile(const QString &newName, QTemporaryFileEngine::MaterializationMode mode)
{
    Q_ASSERT(isUnnamedFile());

#ifdef LINUX_UNNAMED_TMPFILE
    Q_D(QFSFileEngine);
    const QByteArray src = "/proc/self/fd/" + QByteArray::number(d->fd);
    auto materializeAt = [=](const QFileSystemEntry &dst) {
        return ::linkat(AT_FDCWD, src, AT_FDCWD, dst.nativeFilePath(), AT_SYMLINK_FOLLOW) == 0;
    };
#else
    auto materializeAt = [](const QFileSystemEntry &) { return false; };
#endif

    auto success = [this](const QFileSystemEntry &entry) {
        filePathIsTemplate = false;
        unnamedFile = false;
        d_func()->fileEntry = entry;
        return true;
    };

    auto materializeAsTemplate = [=](const QString &newName) {
        QTemporaryFileName tfn(newName);
        static const int maxAttempts = 16;
        for (int attempt = 0; attempt < maxAttempts; ++attempt) {
            tfn.generateNext();
            QFileSystemEntry entry(tfn.path, QFileSystemEntry::FromNativePath());
            if (materializeAt(entry))
                return success(entry);
        }
        return false;
    };

    if (mode == NameIsTemplate) {
        if (materializeAsTemplate(newName))
            return true;
    } else {
        // Use linkat to materialize the file
        QFileSystemEntry dst(newName);
        if (materializeAt(dst))
            return success(dst);

        if (errno == EEXIST && mode == Overwrite) {
            // retry by first creating a temporary file in the right dir
            if (!materializeAsTemplate(templateName))
                return false;

            // then rename the materialized file to target (same as renameOverwrite)
            QFSFileEngine::close();
            return QFSFileEngine::renameOverwrite(newName);
        }
    }

    // failed
    setError(QFile::RenameError, QSystemError(errno, QSystemError::NativeError).toString());
    return false;
}